

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_data_collection_scanner.cpp
# Opt level: O1

void duckdb::RowDataCollectionScanner::AlignHeapBlocks
               (RowDataCollection *swizzled_block_collection,RowDataCollection *swizzled_string_heap
               ,RowDataCollection *block_collection,RowDataCollection *string_heap,RowLayout *layout
               )

{
  data_ptr_t base_row_ptr;
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  reference pvVar5;
  pointer pRVar6;
  BlockHandle *pBVar7;
  unsigned_long base_offset;
  undefined4 extraout_var;
  element_type *peVar8;
  pair<unsigned_char_*,_unsigned_long> *ptr_and_size;
  idx_t iVar9;
  ulong base_offset_00;
  pointer this;
  ulong uVar10;
  data_ptr_t pdVar11;
  idx_t iVar12;
  vector<std::pair<unsigned_char_*,_unsigned_long>,_true> ptrs_and_sizes;
  BufferHandle new_heap_handle;
  unsigned_long size;
  BufferHandle data_handle;
  RowDataBlock local_d8;
  BufferHandle local_a8;
  RowDataCollection *local_90;
  RowDataCollection *local_88;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *local_80;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_78;
  vector<duckdb::BufferHandle,_true> *local_70;
  unsigned_long local_68;
  RowDataCollection *local_60;
  RowDataCollection *local_58;
  pointer local_50;
  BufferHandle local_48;
  
  if (block_collection->count != 0) {
    local_90 = swizzled_string_heap;
    local_88 = string_heap;
    if (layout->all_constant == true) {
      RowDataCollection::Merge(swizzled_block_collection,block_collection);
      return;
    }
    local_d8.count = (idx_t)block_collection->buffer_manager;
    local_78 = &string_heap->blocks;
    local_60 = swizzled_block_collection;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::operator[](local_78,0);
    pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar5);
    this = (block_collection->blocks).
           super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (block_collection->blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_58 = block_collection;
    if (this != local_50) {
      iVar12 = pRVar6->count;
      local_d8.entry_size = (idx_t)&local_90->blocks;
      local_70 = &local_90->pinned_blocks;
      local_d8.byte_offset = 0;
      do {
        if (iVar12 == 0) {
          local_d8.byte_offset = local_d8.byte_offset + 1;
          pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   ::operator[](local_78,local_d8.byte_offset);
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(pvVar5);
          iVar12 = pRVar6->count;
        }
        pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(this);
        (*(*(_func_int ***)local_d8.count)[7])(&local_48,local_d8.count,pRVar6);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.node);
        base_row_ptr = (local_48.node.ptr)->buffer;
        if (local_88->keep_pinned == false) {
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(this);
          RowOperations::SwizzleColumns(layout,base_row_ptr,pRVar6->count);
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(this);
          pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pRVar6->block);
          pBVar7->unswizzled = (char *)0x0;
        }
        pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(this);
        if (iVar12 < pRVar6->count) {
          if (local_88->keep_pinned == true) {
            pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                     ::operator->(this);
            RowOperations::SwizzleColumns(layout,base_row_ptr,pRVar6->count);
          }
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(this);
          iVar9 = pRVar6->count;
          local_d8.block.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_d8.block.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_d8.capacity = 0;
          local_80 = this;
          if (iVar9 == 0) {
            base_offset_00 = 0;
          }
          else {
            base_offset_00 = 0;
            pdVar11 = base_row_ptr;
            do {
              if (iVar12 == 0) {
                local_d8.byte_offset = local_d8.byte_offset + 1;
                pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                         ::operator[](local_78,local_d8.byte_offset);
                pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                         ::operator->(pvVar5);
                iVar12 = pRVar6->count;
              }
              uVar10 = iVar12;
              if (iVar9 < iVar12) {
                uVar10 = iVar9;
              }
              local_a8.handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(element_type **)(pdVar11 + layout->heap_pointer_offset);
              local_68 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                   ((long)*(uint **)(pdVar11 +
                                                    (uVar10 - 1) * layout->row_width +
                                                    layout->heap_pointer_offset) +
                                    ((ulong)**(uint **)(pdVar11 +
                                                       (uVar10 - 1) * layout->row_width +
                                                       layout->heap_pointer_offset) -
                                    (long)local_a8.handle.internal.
                                          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr));
              ::std::
              vector<std::pair<unsigned_char*,unsigned_long>,std::allocator<std::pair<unsigned_char*,unsigned_long>>>
              ::emplace_back<unsigned_char*&,unsigned_long&>
                        ((vector<std::pair<unsigned_char*,unsigned_long>,std::allocator<std::pair<unsigned_char*,unsigned_long>>>
                          *)&local_d8,(uchar **)&local_a8,&local_68);
              RowOperations::SwizzleHeapPointer
                        (layout,pdVar11,
                         (data_ptr_t)
                         local_a8.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         uVar10,base_offset_00);
              base_offset_00 = base_offset_00 + local_68;
              pdVar11 = pdVar11 + layout->row_width * uVar10;
              iVar12 = iVar12 - uVar10;
              iVar9 = iVar9 - uVar10;
            } while (iVar9 != 0);
          }
          iVar4 = (*(*(_func_int ***)local_d8.count)[0xf])();
          peVar8 = (element_type *)operator_new(0x30);
          uVar10 = CONCAT44(extraout_var,iVar4);
          if (CONCAT44(extraout_var,iVar4) < base_offset_00) {
            uVar10 = base_offset_00;
          }
          RowDataBlock::RowDataBlock
                    ((RowDataBlock *)peVar8,ORDER_BY,(BufferManager *)local_d8.count,uVar10,1);
          local_a8.handle.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
          ::std::
          vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                      *)local_d8.entry_size,
                     (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      *)&local_a8);
          peVar8 = local_a8.handle.internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (local_a8.handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            p_Var2 = (((__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)
                      &((local_a8.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal)
                     ->_M_refcount)._M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            operator_delete(peVar8);
          }
          pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                           *)local_d8.entry_size);
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(pvVar5);
          (*(*(_func_int ***)local_d8.count)[7])(&local_a8,local_d8.count,pRVar6);
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_a8.node);
          _Var3._M_pi = local_d8.block.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          if (local_d8.block.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)
              local_d8.block.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          {
            pdVar11 = (local_a8.node.ptr)->buffer;
            peVar8 = local_d8.block.internal.
                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            do {
              switchD_015ff80e::default
                        (pdVar11,(peVar8->super_enable_shared_from_this<duckdb::BlockHandle>).
                                 __weak_this_.internal.
                                 super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,
                         (size_t)(peVar8->super_enable_shared_from_this<duckdb::BlockHandle>).
                                 __weak_this_.internal.
                                 super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
              pdVar11 = pdVar11 + (long)(peVar8->super_enable_shared_from_this<duckdb::BlockHandle>)
                                        .__weak_this_.internal.
                                        super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
              peVar8 = (element_type *)&peVar8->block_manager;
            } while (peVar8 != (element_type *)_Var3._M_pi);
          }
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_a8.node);
          if (local_90->keep_pinned != false) {
            pdVar11 = (local_a8.node.ptr)->buffer;
            ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
            emplace_back<duckdb::BufferHandle>
                      (&local_70->
                        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
                       &local_a8);
            pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                     ::operator->(local_80);
            RowOperations::UnswizzlePointers(layout,base_row_ptr,pdVar11,pRVar6->count);
            pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                     ::operator->(local_80);
            RowOperations::UnswizzleHeapPointer(layout,base_row_ptr,pdVar11,pRVar6->count);
          }
          BufferHandle::~BufferHandle(&local_a8);
          this = local_80;
          if (local_d8.block.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            operator_delete(local_d8.block.internal.
                            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
            this = local_80;
          }
        }
        else {
          pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   ::operator[](local_78,local_d8.byte_offset);
          unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
          operator->(pvVar5);
          RowDataBlock::Copy(&local_d8);
          ::std::
          vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                      *)local_d8.entry_size,
                     (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      *)&local_d8);
          peVar8 = local_d8.block.internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (local_d8.block.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            p_Var2 = ((local_d8.block.internal.
                       super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
                     super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            operator_delete(peVar8);
          }
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(this);
          iVar9 = pRVar6->count;
          pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                           *)local_d8.entry_size);
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(pvVar5);
          pRVar6->count = iVar9;
          pvVar5 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                           *)local_d8.entry_size);
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(pvVar5);
          (*(*(_func_int ***)local_d8.count)[7])(&local_d8,local_d8.count,pRVar6);
          if (local_90->keep_pinned == false) {
            pdVar11 = *(data_ptr_t *)(base_row_ptr + layout->heap_pointer_offset);
            optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                      ((optional_ptr<duckdb::FileBuffer,_true> *)&local_d8.capacity);
            lVar1 = *(long *)(local_d8.capacity + 0x10);
            pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                     ::operator->(this);
            iVar9 = pRVar6->count;
            base_offset = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                    ((long)pdVar11 - lVar1);
            RowOperations::SwizzleHeapPointer(layout,base_row_ptr,pdVar11,iVar9,base_offset);
          }
          else {
            ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
            emplace_back<duckdb::BufferHandle>
                      (&local_70->
                        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
                       (BufferHandle *)&local_d8);
          }
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(this);
          iVar12 = iVar12 - pRVar6->count;
          BufferHandle::~BufferHandle((BufferHandle *)&local_d8);
        }
        BufferHandle::~BufferHandle(&local_48);
        this = this + 1;
      } while (this != local_50);
    }
    RowDataCollection::Merge(local_60,local_58);
    local_90->count = local_88->count;
    RowDataCollection::Clear(local_88);
  }
  return;
}

Assistant:

void RowDataCollectionScanner::AlignHeapBlocks(RowDataCollection &swizzled_block_collection,
                                               RowDataCollection &swizzled_string_heap,
                                               RowDataCollection &block_collection, RowDataCollection &string_heap,
                                               const RowLayout &layout) {
	if (block_collection.count == 0) {
		return;
	}

	if (layout.AllConstant()) {
		// No heap blocks! Just merge fixed-size data
		swizzled_block_collection.Merge(block_collection);
		return;
	}

	// We create one heap block per data block and swizzle the pointers
	D_ASSERT(string_heap.keep_pinned == swizzled_string_heap.keep_pinned);
	auto &buffer_manager = block_collection.buffer_manager;
	auto &heap_blocks = string_heap.blocks;
	idx_t heap_block_idx = 0;
	idx_t heap_block_remaining = heap_blocks[heap_block_idx]->count;
	for (auto &data_block : block_collection.blocks) {
		if (heap_block_remaining == 0) {
			heap_block_remaining = heap_blocks[++heap_block_idx]->count;
		}

		// Pin the data block and swizzle the pointers within the rows
		auto data_handle = buffer_manager.Pin(data_block->block);
		auto data_ptr = data_handle.Ptr();
		if (!string_heap.keep_pinned) {
			D_ASSERT(!data_block->block->IsSwizzled());
			RowOperations::SwizzleColumns(layout, data_ptr, data_block->count);
			data_block->block->SetSwizzling(nullptr);
		}
		// At this point the data block is pinned and the heap pointer is valid
		// so we can copy heap data as needed

		// We want to copy as little of the heap data as possible, check how the data and heap blocks line up
		if (heap_block_remaining >= data_block->count) {
			// Easy: current heap block contains all strings for this data block, just copy (reference) the block
			swizzled_string_heap.blocks.emplace_back(heap_blocks[heap_block_idx]->Copy());
			swizzled_string_heap.blocks.back()->count = data_block->count;

			// Swizzle the heap pointer if we are not pinning the heap
			auto &heap_block = swizzled_string_heap.blocks.back()->block;
			auto heap_handle = buffer_manager.Pin(heap_block);
			if (!swizzled_string_heap.keep_pinned) {
				auto heap_ptr = Load<data_ptr_t>(data_ptr + layout.GetHeapOffset());
				auto heap_offset = heap_ptr - heap_handle.Ptr();
				RowOperations::SwizzleHeapPointer(layout, data_ptr, heap_ptr, data_block->count,
				                                  NumericCast<idx_t>(heap_offset));
			} else {
				swizzled_string_heap.pinned_blocks.emplace_back(std::move(heap_handle));
			}

			// Update counter
			heap_block_remaining -= data_block->count;
		} else {
			// Strings for this data block are spread over the current heap block and the next (and possibly more)
			if (string_heap.keep_pinned) {
				// The heap is changing underneath the data block,
				// so swizzle the string pointers to make them portable.
				RowOperations::SwizzleColumns(layout, data_ptr, data_block->count);
			}
			idx_t data_block_remaining = data_block->count;
			vector<std::pair<data_ptr_t, idx_t>> ptrs_and_sizes;
			idx_t total_size = 0;
			const auto base_row_ptr = data_ptr;
			while (data_block_remaining > 0) {
				if (heap_block_remaining == 0) {
					heap_block_remaining = heap_blocks[++heap_block_idx]->count;
				}
				auto next = MinValue<idx_t>(data_block_remaining, heap_block_remaining);

				// Figure out where to start copying strings, and how many bytes we need to copy
				auto heap_start_ptr = Load<data_ptr_t>(data_ptr + layout.GetHeapOffset());
				auto heap_end_ptr =
				    Load<data_ptr_t>(data_ptr + layout.GetHeapOffset() + (next - 1) * layout.GetRowWidth());
				auto size = NumericCast<idx_t>(heap_end_ptr - heap_start_ptr + Load<uint32_t>(heap_end_ptr));
				ptrs_and_sizes.emplace_back(heap_start_ptr, size);
				D_ASSERT(size <= heap_blocks[heap_block_idx]->byte_offset);

				// Swizzle the heap pointer
				RowOperations::SwizzleHeapPointer(layout, data_ptr, heap_start_ptr, next, total_size);
				total_size += size;

				// Update where we are in the data and heap blocks
				data_ptr += next * layout.GetRowWidth();
				data_block_remaining -= next;
				heap_block_remaining -= next;
			}

			// Finally, we allocate a new heap block and copy data to it
			swizzled_string_heap.blocks.emplace_back(make_uniq<RowDataBlock>(
			    MemoryTag::ORDER_BY, buffer_manager, MaxValue<idx_t>(total_size, buffer_manager.GetBlockSize()), 1U));
			auto new_heap_handle = buffer_manager.Pin(swizzled_string_heap.blocks.back()->block);
			auto new_heap_ptr = new_heap_handle.Ptr();
			for (auto &ptr_and_size : ptrs_and_sizes) {
				memcpy(new_heap_ptr, ptr_and_size.first, ptr_and_size.second);
				new_heap_ptr += ptr_and_size.second;
			}
			new_heap_ptr = new_heap_handle.Ptr();
			if (swizzled_string_heap.keep_pinned) {
				// Since the heap blocks are pinned, we can unswizzle the data again.
				swizzled_string_heap.pinned_blocks.emplace_back(std::move(new_heap_handle));
				RowOperations::UnswizzlePointers(layout, base_row_ptr, new_heap_ptr, data_block->count);
				RowOperations::UnswizzleHeapPointer(layout, base_row_ptr, new_heap_ptr, data_block->count);
			}
		}
	}

	// We're done with variable-sized data, now just merge the fixed-size data
	swizzled_block_collection.Merge(block_collection);
	D_ASSERT(swizzled_block_collection.blocks.size() == swizzled_string_heap.blocks.size());

	// Update counts and cleanup
	swizzled_string_heap.count = string_heap.count;
	string_heap.Clear();
}